

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O1

void fix_petrification(void)

{
  boolean bVar1;
  schar sVar2;
  undefined8 in_RAX;
  undefined8 extraout_RDX;
  char *pcVar3;
  
  u.uprops[0x21].intrinsic = 0;
  delayed_killer = (char *)0x0;
  if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
    if (u.umonnum != u.umonster) {
      bVar1 = dmgtype(youmonst.data,0x24);
      if (bVar1 != '\0') goto LAB_0018ee03;
    }
    sVar2 = acurr(5);
    pcVar3 = "";
    if ('\x0f' < sVar2) {
      pcVar3 = "fine ";
    }
    pline("What a pity - you just ruined a future piece of %sart!",pcVar3,extraout_RDX,in_RAX);
    return;
  }
LAB_0018ee03:
  pline("You feel limber!");
  return;
}

Assistant:

void fix_petrification(void)
{
	Stoned = 0;
	delayed_killer = 0;
	if (Hallucination)
	    pline("What a pity - you just ruined a future piece of %sart!",
		  ACURR(A_CHA) > 15 ? "fine " : "");
	else
	    pline("You feel limber!");
}